

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftadvanc.c
# Opt level: O0

FT_Error FT_Get_Advances(FT_Face face,FT_UInt start,FT_UInt count,FT_Int32 flags,FT_Fixed *padvances
                        )

{
  FT_Face_GetAdvancesFunc p_Var1;
  uint uVar2;
  FT_Error FVar3;
  int iVar4;
  long local_58;
  uint local_4c;
  FT_Int factor;
  FT_UInt nn;
  FT_UInt end;
  FT_UInt num;
  FT_Face_GetAdvancesFunc func;
  FT_Error error;
  FT_Fixed *padvances_local;
  FT_Int32 flags_local;
  FT_UInt count_local;
  FT_UInt start_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (padvances == (FT_Fixed *)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    uVar2 = (uint)face->num_glyphs;
    if (((start < uVar2) && (start <= start + count)) && (start + count <= uVar2)) {
      if (count == 0) {
        face_local._4_4_ = 0;
      }
      else {
        p_Var1 = face->driver->clazz->get_advances;
        if ((p_Var1 != (FT_Face_GetAdvancesFunc)0x0) &&
           (((flags & 3U) != 0 || ((flags >> 0x10 & 0xfU) == 1)))) {
          uVar2 = (*p_Var1)(face,start,count,flags,padvances);
          if (uVar2 == 0) {
            FVar3 = _ft_face_scale_advances(face,padvances,count,flags);
            return FVar3;
          }
          if ((uVar2 & 0xff) != 7) {
            return uVar2;
          }
        }
        func._4_4_ = 0;
        if ((flags & 0x20000000U) == 0) {
          iVar4 = 0x400;
          if ((flags & 1U) != 0) {
            iVar4 = 1;
          }
          local_4c = 0;
          while ((local_4c < count &&
                 (func._4_4_ = FT_Load_Glyph(face,start + local_4c,flags | 0x100), func._4_4_ == 0))
                ) {
            if ((flags & 0x10U) == 0) {
              local_58 = (face->glyph->advance).x * (long)iVar4;
            }
            else {
              local_58 = (face->glyph->advance).y * (long)iVar4;
            }
            padvances[local_4c] = local_58;
            local_4c = local_4c + 1;
          }
          face_local._4_4_ = func._4_4_;
        }
        else {
          face_local._4_4_ = 7;
        }
      }
    }
    else {
      face_local._4_4_ = 0x10;
    }
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Advances( FT_Face    face,
                   FT_UInt    start,
                   FT_UInt    count,
                   FT_Int32   flags,
                   FT_Fixed  *padvances )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Face_GetAdvancesFunc  func;

    FT_UInt  num, end, nn;
    FT_Int   factor;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !padvances )
      return FT_THROW( Invalid_Argument );

    num = (FT_UInt)face->num_glyphs;
    end = start + count;
    if ( start >= num || end < start || end > num )
      return FT_THROW( Invalid_Glyph_Index );

    if ( count == 0 )
      return FT_Err_Ok;

    func = face->driver->clazz->get_advances;
    if ( func && LOAD_ADVANCE_FAST_CHECK( face, flags ) )
    {
      error = func( face, start, count, flags, padvances );
      if ( !error )
        return _ft_face_scale_advances( face, padvances, count, flags );

      if ( FT_ERR_NEQ( error, Unimplemented_Feature ) )
        return error;
    }

    error = FT_Err_Ok;

    if ( flags & FT_ADVANCE_FLAG_FAST_ONLY )
      return FT_THROW( Unimplemented_Feature );

    flags |= (FT_UInt32)FT_LOAD_ADVANCE_ONLY;
    factor = ( flags & FT_LOAD_NO_SCALE ) ? 1 : 1024;
    for ( nn = 0; nn < count; nn++ )
    {
      error = FT_Load_Glyph( face, start + nn, flags );
      if ( error )
        break;

      /* scale from 26.6 to 16.16, unless NO_SCALE was requested */
      padvances[nn] = ( flags & FT_LOAD_VERTICAL_LAYOUT )
                      ? face->glyph->advance.y * factor
                      : face->glyph->advance.x * factor;
    }

    return error;
  }